

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb4Image.c
# Opt level: O2

Vec_Ptr_t * Llb_Nonlin4Group(DdManager *dd,Vec_Ptr_t *vParts,Vec_Int_t *vVars2Q,int nSizeMax)

{
  Llb_Prt_t *pLVar1;
  DdNode *Entry;
  int iVar2;
  int iVar3;
  Llb_Mgr_t_conflict *p;
  Vec_Ptr_t *p_00;
  long lVar4;
  Llb_Prt_t *pPart2;
  Llb_Prt_t *pPart1;
  Llb_Prt_t *local_40;
  Llb_Prt_t *local_38;
  
  p = Llb_Nonlin4Alloc(dd,vParts,(DdNode *)0x0,vVars2Q,nSizeMax);
  iVar3 = p->iPartFree;
  for (lVar4 = 0; lVar4 < iVar3; lVar4 = lVar4 + 1) {
    pLVar1 = p->pParts[lVar4];
    if ((pLVar1 != (Llb_Prt_t *)0x0) && (iVar2 = Llb_Nonlin4HasSingletonVars(p,pLVar1), iVar2 != 0))
    {
      Llb_Nonlin4Quantify1(p,pLVar1);
    }
  }
  Llb_Nonlin4RecomputeScores(p);
  while( true ) {
    iVar3 = Llb_Nonlin4NextPartitions(p,&local_38,&local_40);
    if (iVar3 == 0) {
      p_00 = Vec_PtrAlloc(1000);
      iVar3 = p->iPartFree;
      lVar4 = 0;
      do {
        if (iVar3 <= lVar4) {
          Llb_Nonlin4Free(p);
          return p_00;
        }
        pLVar1 = p->pParts[lVar4];
        if (pLVar1 != (Llb_Prt_t *)0x0) {
          Entry = pLVar1->bFunc;
          if (*(int *)((ulong)Entry & 0xfffffffffffffffe) == 0x7fffffff) {
            if (((ulong)Entry & 1) != 0) {
              __assert_fail("!Cudd_IsComplement(pPart->bFunc)",
                            "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/bdd/llb/llb4Image.c"
                            ,0x34a,
                            "Vec_Ptr_t *Llb_Nonlin4Group(DdManager *, Vec_Ptr_t *, Vec_Int_t *, int)"
                           );
            }
          }
          else {
            Vec_PtrPush(p_00,Entry);
            Cudd_Ref(pLVar1->bFunc);
          }
        }
        lVar4 = lVar4 + 1;
      } while( true );
    }
    iVar3 = Cudd_ReadReorderings(dd);
    iVar2 = Llb_Nonlin4Quantify2(p,local_38,local_40);
    if (iVar2 == 0) break;
    iVar2 = Cudd_ReadReorderings(dd);
    if (iVar3 < iVar2) {
      Llb_Nonlin4RecomputeScores(p);
    }
  }
  Llb_Nonlin4Free(p);
  return (Vec_Ptr_t *)0x0;
}

Assistant:

Vec_Ptr_t * Llb_Nonlin4Group( DdManager * dd, Vec_Ptr_t * vParts, Vec_Int_t * vVars2Q, int nSizeMax )
{
    Vec_Ptr_t * vGroups;
    Llb_Prt_t * pPart, * pPart1, * pPart2;
    Llb_Mgr_t * p;
    int i, nReorders;//, clk = Abc_Clock();
    // start the manager
    p = Llb_Nonlin4Alloc( dd, vParts, NULL, vVars2Q, nSizeMax );
    // remove singles
    Llb_MgrForEachPart( p, pPart, i )
        if ( Llb_Nonlin4HasSingletonVars(p, pPart) )
            Llb_Nonlin4Quantify1( p, pPart );
    // compute scores
    Llb_Nonlin4RecomputeScores( p );
    // iteratively quantify variables
    while ( Llb_Nonlin4NextPartitions(p, &pPart1, &pPart2) )
    {
        nReorders = Cudd_ReadReorderings(dd);
        if ( !Llb_Nonlin4Quantify2( p, pPart1, pPart2 ) )
        {
            Llb_Nonlin4Free( p );
            return NULL;
        }
        if ( nReorders < Cudd_ReadReorderings(dd) )
            Llb_Nonlin4RecomputeScores( p );
//        else
//            Llb_Nonlin4VerifyScores( p );
    }
    // load partitions
    vGroups = Vec_PtrAlloc( 1000 );
    Llb_MgrForEachPart( p, pPart, i )
    {
//printf( "Iteration %d ", pPart->iPart );
        if ( Cudd_IsConstant(pPart->bFunc) )
        {
//printf( "Constant\n" );
            assert( !Cudd_IsComplement(pPart->bFunc) );
            continue;
        }
//printf( "\n" );
        Vec_PtrPush( vGroups, pPart->bFunc );
        Cudd_Ref( pPart->bFunc );
//printf( "Part %d  ", pPart->iPart );
//Extra_bddPrintSupport( p->dd, pPart->bFunc ); printf( "\n" );
    }
    Llb_Nonlin4Free( p );
//Abc_PrintTime( 1, "Reparametrization time", Abc_Clock() - clk );
    return vGroups;
}